

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O2

void lj_err_run(lua_State *L)

{
  uint uVar1;
  int errcode;
  TValue *pTVar2;
  GCstr *pGVar3;
  ulong uVar4;
  TValue *pTVar5;
  uint *puVar6;
  void *pvVar7;
  long lVar8;
  
  uVar4 = (ulong)(L->glref).ptr32;
  if (*(int *)(uVar4 + 400) != 0) {
LAB_0010dec3:
    errcode = 2;
LAB_0010dec5:
    lj_err_throw(L,errcode);
  }
  pTVar5 = L->base + -1;
  pTVar2 = (TValue *)(ulong)(L->stack).ptr32;
  pvVar7 = L->cframe;
LAB_0010ddfc:
  if (pTVar5 <= pTVar2) goto LAB_0010dec3;
  while( true ) {
    if (pvVar7 == (void *)0x0) goto LAB_0010dec3;
    if ((-1 < *(int *)(((ulong)pvVar7 & 0xfffffffffffffffc) + 0x10)) ||
       ((TValue *)((long)pTVar2 - (long)*(int *)((long)pvVar7 + 0x10)) <= pTVar5)) break;
    lVar8 = (long)*(int *)((long)pvVar7 + 0x14);
    if (-1 < lVar8) goto LAB_0010debe;
    pvVar7 = *(void **)((long)pvVar7 + 0x30);
  }
  uVar1 = (pTVar5->field_2).it;
  switch(uVar1 & 7) {
  default:
    pTVar5 = pTVar5 + (-1 - (ulong)*(byte *)((ulong)uVar1 - 3));
    goto LAB_0010ddfc;
  case 1:
    pvVar7 = *(void **)((long)pvVar7 + 0x30);
  case 3:
    pTVar5 = (TValue *)((long)pTVar5 - (long)(int)(uVar1 & 0xfffffff8));
    goto LAB_0010ddfc;
  case 2:
    if (pTVar5[-1].u32.lo == 1) {
LAB_0010de7f:
      pvVar7 = *(void **)((long)pvVar7 + 0x30);
    }
    pTVar5 = (TValue *)((long)pTVar5 - ((long)(int)uVar1 & 0xfffffffffffffff8U));
    goto LAB_0010ddfc;
  case 5:
    if (((ulong)pvVar7 & 1) != 0) goto LAB_0010dec3;
    lVar8 = (long)*(int *)((long)pvVar7 + 0x14);
    if (lVar8 < 0) goto LAB_0010de7f;
    break;
  case 6:
  case 7:
    puVar6 = (uint *)((long)pTVar5 - (long)(int)(uVar1 & 0xfffffff8));
    if (*(char *)((ulong)*puVar6 + 6) != '\x15') goto LAB_0010dec3;
    lVar8 = (long)puVar6 + (8 - (long)pTVar2);
  }
LAB_0010debe:
  if (lVar8 != 0) {
    pTVar5 = L->top;
    puVar6 = (uint *)(uVar4 + 0x31c);
    *puVar6 = *puVar6 & 0xffffffef;
    if ((*(int *)((long)pTVar2 + lVar8 + 4) != -9) || (L->status == '\x05')) {
      pGVar3 = lj_err_str(L,LJ_ERR_ERRERR);
      pTVar5[-1].u32.lo = (uint32_t)pGVar3;
      *(undefined4 *)((long)pTVar5 + -4) = 0xfffffffb;
      errcode = 5;
      goto LAB_0010dec5;
    }
    L->status = '\x05';
    *pTVar5 = pTVar5[-1];
    pTVar5[-1] = *(TValue *)((long)pTVar2 + lVar8);
    L->top = pTVar5 + 1;
    lj_vm_call(L,pTVar5,2);
  }
  goto LAB_0010dec3;
}

Assistant:

LJ_FASTCALL lj_err_run(lua_State *L)
{
  ptrdiff_t ef = (LJ_HASJIT && tvref(G(L)->jit_base)) ? 0 : finderrfunc(L);
  if (ef) {
    TValue *errfunc = restorestack(L, ef);
    TValue *top = L->top;
    lj_trace_abort(G(L));
    if (!tvisfunc(errfunc) || L->status == LUA_ERRERR) {
      setstrV(L, top-1, lj_err_str(L, LJ_ERR_ERRERR));
      lj_err_throw(L, LUA_ERRERR);
    }
    L->status = LUA_ERRERR;
    copyTV(L, top+LJ_FR2, top-1);
    copyTV(L, top-1, errfunc);
    if (LJ_FR2) setnilV(top++);
    L->top = top+1;
    lj_vm_call(L, top, 1+1);  /* Stack: |errfunc|msg| -> |msg| */
  }
  lj_err_throw(L, LUA_ERRRUN);
}